

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TripWireTests.cpp
# Opt level: O0

void __thiscall tripwire_basic_Test::TestBody(tripwire_basic_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_100;
  AssertHelper local_e0;
  Message local_d8;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar__1;
  string local_a8;
  AssertHelper local_88;
  Message local_80;
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  undefined1 local_50 [8];
  TripWireDetector detect;
  undefined1 local_30 [8];
  shared_ptr<gmlc::concurrency::TripWireTrigger> trig;
  TriplineType line;
  tripwire_basic_Test *this_local;
  
  gmlc::concurrency::make_tripline();
  std::make_shared<gmlc::concurrency::TripWireTrigger,std::shared_ptr<std::atomic<bool>>&>
            ((shared_ptr<std::atomic<bool>_> *)local_30);
  std::shared_ptr<std::atomic<bool>_>::shared_ptr
            ((shared_ptr<std::atomic<bool>_> *)&gtest_ar_.message_,
             (shared_ptr<std::atomic<bool>_> *)
             &trig.
              super___shared_ptr<gmlc::concurrency::TripWireTrigger,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  gmlc::concurrency::TripWireDetector::TripWireDetector
            ((TripWireDetector *)local_50,(TriplineType *)&gtest_ar_.message_);
  std::shared_ptr<std::atomic<bool>_>::~shared_ptr
            ((shared_ptr<std::atomic<bool>_> *)&gtest_ar_.message_);
  local_71 = gmlc::concurrency::TripWireDetector::isTripped((TripWireDetector *)local_50);
  local_71 = !local_71;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)local_70,(AssertionResult *)"detect.isTripped()","true","false"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/TripWireTests.cpp"
               ,0x1c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  this_00 = &gtest_ar__1.message_;
  std::shared_ptr<gmlc::concurrency::TripWireTrigger>::shared_ptr
            ((shared_ptr<gmlc::concurrency::TripWireTrigger> *)this_00,(nullptr_t)0x0);
  std::shared_ptr<gmlc::concurrency::TripWireTrigger>::operator=
            ((shared_ptr<gmlc::concurrency::TripWireTrigger> *)local_30,
             (shared_ptr<gmlc::concurrency::TripWireTrigger> *)this_00);
  std::shared_ptr<gmlc::concurrency::TripWireTrigger>::~shared_ptr
            ((shared_ptr<gmlc::concurrency::TripWireTrigger> *)this_00);
  local_c9 = gmlc::concurrency::TripWireDetector::isTripped((TripWireDetector *)local_50);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c8,&local_c9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_100,(internal *)local_c8,(AssertionResult *)"detect.isTripped()","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/TripWireTests.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  gmlc::concurrency::TripWireDetector::~TripWireDetector((TripWireDetector *)local_50);
  std::shared_ptr<gmlc::concurrency::TripWireTrigger>::~shared_ptr
            ((shared_ptr<gmlc::concurrency::TripWireTrigger> *)local_30);
  std::shared_ptr<std::atomic<bool>_>::~shared_ptr
            ((shared_ptr<std::atomic<bool>_> *)
             &trig.
              super___shared_ptr<gmlc::concurrency::TripWireTrigger,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(tripwire, basic)
{
    auto line = make_tripline();
    auto trig = std::make_shared<TripWireTrigger>(line);
    TripWireDetector detect(line);

    EXPECT_FALSE(detect.isTripped());
    trig = nullptr;
    EXPECT_TRUE(detect.isTripped());
}